

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# open62541.c
# Opt level: O2

UA_StatusCode
UA_Client_Subscriptions_removeMonitoredItem
          (UA_Client *client,UA_UInt32 subscriptionId,UA_UInt32 monitoredItemId)

{
  UA_Client_MonitoredItem *pUVar1;
  UA_Client_MonitoredItem **ppUVar2;
  UA_Logger logger;
  char *pcVar3;
  UA_Client_Subscription *pUVar4;
  UA_Client_MonitoredItem *__ptr;
  undefined8 local_158;
  undefined8 uStack_150;
  undefined8 local_148;
  undefined8 uStack_140;
  undefined8 local_138;
  undefined8 uStack_130;
  undefined8 local_128;
  undefined8 uStack_120;
  undefined8 local_118;
  undefined8 uStack_110;
  undefined8 local_108;
  undefined8 uStack_100;
  undefined8 local_f8;
  undefined8 uStack_f0;
  UA_UInt32 local_e8;
  undefined4 local_e4;
  undefined8 local_e0;
  UA_UInt32 *local_d8;
  undefined1 local_d0 [8];
  UA_DeleteMonitoredItemsResponse response;
  
  pUVar4 = (UA_Client_Subscription *)&client->subscriptions;
  do {
    pUVar4 = (pUVar4->listEntry).le_next;
    if (pUVar4 == (UA_Client_Subscription *)0x0) {
      return 0x80280000;
    }
  } while (pUVar4->subscriptionID != subscriptionId);
  __ptr = (UA_Client_MonitoredItem *)&pUVar4->monitoredItems;
  do {
    __ptr = (__ptr->listEntry).le_next;
    if (__ptr == (UA_Client_MonitoredItem *)0x0) {
      return 0x80420000;
    }
  } while (__ptr->monitoredItemId != monitoredItemId);
  local_f8 = 0;
  uStack_f0 = 0;
  local_108 = 0;
  uStack_100 = 0;
  local_118 = 0;
  uStack_110 = 0;
  local_128 = 0;
  uStack_120 = 0;
  local_138 = 0;
  uStack_130 = 0;
  local_148 = 0;
  uStack_140 = 0;
  local_158 = 0;
  uStack_150 = 0;
  local_e4 = 0;
  local_d8 = &__ptr->monitoredItemId;
  local_e0 = 1;
  local_e8 = subscriptionId;
  __UA_Client_Service(client,&local_158,UA_TYPES + 0x66,local_d0,UA_TYPES + 0x4a);
  if ((response.responseHeader.timestamp._4_4_ == 0) &&
     ((UA_Byte *)0x1 < response.responseHeader.additionalHeader.content.encoded.body.data)) {
    response.responseHeader.timestamp._4_4_ = *(UA_StatusCode *)response.resultsSize;
  }
  UA_deleteMembers(local_d0,UA_TYPES + 0x4a);
  if ((response.responseHeader.timestamp._4_4_ == 0x80420000) ||
     (response.responseHeader.timestamp._4_4_ == 0)) {
    pUVar1 = (__ptr->listEntry).le_next;
    ppUVar2 = (__ptr->listEntry).le_prev;
    if (pUVar1 != (UA_Client_MonitoredItem *)0x0) {
      (pUVar1->listEntry).le_prev = ppUVar2;
    }
    *ppUVar2 = pUVar1;
    UA_NodeId_deleteMembers(&__ptr->monitoredNodeId);
    free(__ptr);
    response.responseHeader.timestamp._4_4_ = 0;
  }
  else {
    logger = (client->config).logger;
    pcVar3 = UA_StatusCode_name(response.responseHeader.timestamp._4_4_);
    UA_LOG_INFO(logger,UA_LOGCATEGORY_CLIENT,"Could not remove monitoreditem %u with error code %s",
                (ulong)monitoredItemId,pcVar3);
  }
  return response.responseHeader.timestamp._4_4_;
}

Assistant:

UA_StatusCode
UA_Client_Subscriptions_removeMonitoredItem(UA_Client *client, UA_UInt32 subscriptionId,
                                            UA_UInt32 monitoredItemId) {
    UA_Client_Subscription *sub;
    LIST_FOREACH(sub, &client->subscriptions, listEntry) {
        if(sub->subscriptionID == subscriptionId)
            break;
    }
    if(!sub)
        return UA_STATUSCODE_BADSUBSCRIPTIONIDINVALID;

    UA_Client_MonitoredItem *mon;
    LIST_FOREACH(mon, &sub->monitoredItems, listEntry) {
        if(mon->monitoredItemId == monitoredItemId)
            break;
    }
    if(!mon)
        return UA_STATUSCODE_BADMONITOREDITEMIDINVALID;

    /* remove the monitoreditem remotely */
    UA_DeleteMonitoredItemsRequest request;
    UA_DeleteMonitoredItemsRequest_init(&request);
    request.subscriptionId = sub->subscriptionID;
    request.monitoredItemIdsSize = 1;
    request.monitoredItemIds = &mon->monitoredItemId;
    UA_DeleteMonitoredItemsResponse response = UA_Client_Service_deleteMonitoredItems(client, request);

    UA_StatusCode retval = response.responseHeader.serviceResult;
    if(retval == UA_STATUSCODE_GOOD && response.resultsSize > 1)
        retval = response.results[0];
    UA_DeleteMonitoredItemsResponse_deleteMembers(&response);
    if(retval != UA_STATUSCODE_GOOD &&
       retval != UA_STATUSCODE_BADMONITOREDITEMIDINVALID) {
        UA_LOG_INFO(client->config.logger, UA_LOGCATEGORY_CLIENT,
                    "Could not remove monitoreditem %u with error code %s",
                    monitoredItemId, UA_StatusCode_name(retval));
        return retval;
    }

    LIST_REMOVE(mon, listEntry);
    UA_NodeId_deleteMembers(&mon->monitoredNodeId);
    UA_free(mon);
    return UA_STATUSCODE_GOOD;
}